

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
bmp_image::read_pixel_data
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          istream *input,uint32_t offset,int32_t height,uint32_t stride)

{
  istream *piVar1;
  long lVar2;
  uchar *puVar3;
  ulong uVar4;
  allocator<unsigned_char> local_3a;
  undefined1 local_39;
  fpos<__mbstate_t> local_38;
  uint32_t local_24;
  int32_t local_20;
  uint32_t stride_local;
  int32_t height_local;
  uint32_t offset_local;
  istream *input_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pixel_data;
  
  local_24 = stride;
  local_20 = height;
  stride_local = offset;
  _height_local = input;
  input_local = (istream *)__return_storage_ptr__;
  std::fpos<__mbstate_t>::fpos(&local_38,(ulong)offset);
  std::istream::seekg(input,local_38._M_off,local_38._M_state);
  local_39 = 0;
  lVar2 = (long)local_20;
  uVar4 = (ulong)local_24;
  std::allocator<unsigned_char>::allocator(&local_3a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,lVar2 * uVar4,&local_3a);
  std::allocator<unsigned_char>::~allocator(&local_3a);
  piVar1 = _height_local;
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__);
  std::istream::read((char *)piVar1,(long)puVar3);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<uint8_t> read_pixel_data(std::istream& input, const uint32_t offset, const int32_t height,
                                                const uint32_t stride)
    {
        input.seekg(offset);

        std::vector<uint8_t> pixel_data(static_cast<size_t>(height) * stride);
        input.read(reinterpret_cast<char*>(pixel_data.data()), static_cast<std::streamsize>(pixel_data.size()));

        return pixel_data;
    }